

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrontLoadedReporterFactory.cpp
# Opt level: O0

shared_ptr<ApprovalTests::Reporter> *
ApprovalTests::FrontLoadedReporterFactory::frontLoadedReporter(void)

{
  int iVar1;
  shared_ptr<ApprovalTests::DefaultFrontLoadedReporter> *in_stack_ffffffffffffffd8;
  shared_ptr<ApprovalTests::Reporter> *in_stack_ffffffffffffffe0;
  
  if (frontLoadedReporter()::reporter == '\0') {
    iVar1 = __cxa_guard_acquire(&frontLoadedReporter()::reporter);
    if (iVar1 != 0) {
      ::std::make_shared<ApprovalTests::DefaultFrontLoadedReporter>();
      ::std::shared_ptr<ApprovalTests::Reporter>::
      shared_ptr<ApprovalTests::DefaultFrontLoadedReporter,void>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      ::std::shared_ptr<ApprovalTests::DefaultFrontLoadedReporter>::~shared_ptr
                ((shared_ptr<ApprovalTests::DefaultFrontLoadedReporter> *)0x1ecab5);
      __cxa_atexit(Catch::clara::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr,
                   &frontLoadedReporter::reporter,&__dso_handle);
      __cxa_guard_release(&frontLoadedReporter()::reporter);
    }
  }
  return &frontLoadedReporter::reporter;
}

Assistant:

std::shared_ptr<Reporter>& FrontLoadedReporterFactory::frontLoadedReporter()
    {
        static std::shared_ptr<Reporter> reporter =
            std::make_shared<DefaultFrontLoadedReporter>();
        return reporter;
    }